

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigScl.c
# Opt level: O2

Aig_Man_t *
Aig_ManScl(Aig_Man_t *pAig,int fLatchConst,int fLatchEqual,int fUseMvSweep,int nFramesSymb,
          int nFramesSatur,int fVerbose,int fVeryVerbose)

{
  uint nCap;
  int iVar1;
  int iVar2;
  Aig_Man_t *pAVar3;
  Vec_Int_t *pVVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  ulong uVar7;
  int i;
  int iVar8;
  ulong uVar9;
  Aig_Obj_t *pAVar10;
  
  if ((pAig->vClockDoms != (Vec_Vec_t *)0x0) && (0 < pAig->vClockDoms->nSize)) {
    pAVar3 = Aig_ManSclPart(pAig,fLatchConst,fLatchEqual,fVerbose);
    return pAVar3;
  }
  if (pAig->vFlopNums != (Vec_Int_t *)0x0) {
    __assert_fail("pAig->vFlopNums == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigScl.c"
                  ,0x297,"Aig_Man_t *Aig_ManScl(Aig_Man_t *, int, int, int, int, int, int, int)");
  }
  pAVar3 = Aig_ManDupSimple(pAig);
  nCap = pAVar3->nRegs;
  pVVar4 = Vec_IntAlloc(nCap);
  pVVar4->nSize = nCap;
  uVar7 = 0;
  uVar9 = (ulong)nCap;
  if ((int)nCap < 1) {
    uVar9 = uVar7;
  }
  for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
    pVVar4->pArray[uVar7] = (int)uVar7;
  }
  pAVar3->vFlopNums = pVVar4;
  pVVar4 = Vec_IntAlloc(100);
  pAVar3->vFlopReprs = pVVar4;
  Aig_ManSeqCleanup(pAVar3);
  if ((fLatchConst != 0) && (pAVar3->nRegs != 0)) {
    pAVar3 = Aig_ManConstReduce(pAVar3,fUseMvSweep,nFramesSymb,nFramesSatur,fVerbose,fVeryVerbose);
  }
  if ((fLatchEqual != 0) && (pAVar3->nRegs != 0)) {
    pAVar3 = Aig_ManReduceLaches(pAVar3,fVerbose);
  }
  iVar8 = pAig->nObjs[2] - pAig->nRegs;
  Aig_ManReprStart(pAig,pAig->vObjs->nSize);
  i = 0;
  while( true ) {
    if (pAVar3->vFlopReprs->nSize <= i) {
      Aig_ManStop(pAVar3);
      pAVar3 = Aig_ManDupRepr(pAig,0);
      Aig_ManSeqCleanup(pAVar3);
      return pAVar3;
    }
    iVar1 = Vec_IntEntry(pAVar3->vFlopReprs,i);
    iVar2 = Vec_IntEntry(pAVar3->vFlopReprs,i + 1);
    pAVar5 = Aig_ManCi(pAig,iVar1 + iVar8);
    if (iVar2 == -1) {
      pAVar6 = pAig->pConst1;
    }
    else {
      pAVar6 = Aig_ManCi(pAig,iVar2 + iVar8);
    }
    if (pAVar5 == pAVar6) break;
    pAVar10 = pAVar5;
    iVar1 = pAVar6->Id;
    if (pAVar6->Id < pAVar5->Id) {
      pAVar10 = pAVar6;
      iVar1 = pAVar5->Id;
    }
    pAig->pReprs[iVar1] = pAVar10;
    i = i + 2;
  }
  __assert_fail("pFlop1 != pFlop2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigScl.c"
                ,0x2aa,"Aig_Man_t *Aig_ManScl(Aig_Man_t *, int, int, int, int, int, int, int)");
}

Assistant:

Aig_Man_t * Aig_ManScl( Aig_Man_t * pAig, int fLatchConst, int fLatchEqual, int fUseMvSweep, int nFramesSymb, int nFramesSatur, int fVerbose, int fVeryVerbose )
{
    extern void Saig_ManReportUselessRegisters( Aig_Man_t * pAig );
    extern int Saig_ManReportComplements( Aig_Man_t * p );

    Aig_Man_t * pAigInit, * pAigNew;
    Aig_Obj_t * pFlop1, * pFlop2;
    int i, Entry1, Entry2, nTruePis;//, nRegs;

    if ( pAig->vClockDoms && Vec_VecSize(pAig->vClockDoms) > 0 )
        return Aig_ManSclPart( pAig, fLatchConst, fLatchEqual, fVerbose);

    // store the original AIG
    assert( pAig->vFlopNums == NULL );
    pAigInit = pAig;
    pAig = Aig_ManDupSimple( pAig );
    // create storage for latch numbers
    pAig->vFlopNums = Vec_IntStartNatural( pAig->nRegs );
    pAig->vFlopReprs = Vec_IntAlloc( 100 );
    Aig_ManSeqCleanup( pAig );
    if ( fLatchConst && pAig->nRegs )
        pAig = Aig_ManConstReduce( pAig, fUseMvSweep, nFramesSymb, nFramesSatur, fVerbose, fVeryVerbose );
    if ( fLatchEqual && pAig->nRegs )
        pAig = Aig_ManReduceLaches( pAig, fVerbose );
    // translate pairs into reprs
    nTruePis = Aig_ManCiNum(pAigInit)-Aig_ManRegNum(pAigInit);
    Aig_ManReprStart( pAigInit, Aig_ManObjNumMax(pAigInit) );
    Vec_IntForEachEntry( pAig->vFlopReprs, Entry1, i )
    {
        Entry2 = Vec_IntEntry( pAig->vFlopReprs, ++i ); 
        pFlop1 = Aig_ManCi( pAigInit, nTruePis + Entry1 );
        pFlop2 = (Entry2 == -1)? Aig_ManConst1(pAigInit) : Aig_ManCi( pAigInit, nTruePis + Entry2 );
        assert( pFlop1 != pFlop2 );
        if ( pFlop1->Id > pFlop2->Id )
            pAigInit->pReprs[pFlop1->Id] = pFlop2;
        else
            pAigInit->pReprs[pFlop2->Id] = pFlop1;
    }
    Aig_ManStop( pAig );
//    Aig_ManSeqCleanup( pAigInit );
    pAigNew = Aig_ManDupRepr( pAigInit, 0 );
    Aig_ManSeqCleanup( pAigNew );

//    Saig_ManReportUselessRegisters( pAigNew );
    if ( Aig_ManRegNum(pAigNew) == 0 )
        return pAigNew;
//    nRegs = Saig_ManReportComplements( pAigNew );
//    if ( nRegs ) 
//    printf( "The number of complemented registers = %d.\n", nRegs );
    return pAigNew;
}